

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlNodeBufGetContent(xmlBufferPtr buffer,xmlNode *cur)

{
  int iVar1;
  xmlBufPtr buf_00;
  xmlBufferPtr pxVar2;
  int ret;
  xmlBufPtr buf;
  xmlNode *cur_local;
  xmlBufferPtr buffer_local;
  
  if ((cur == (xmlNode *)0x0) || (buffer == (xmlBufferPtr)0x0)) {
    buffer_local._4_4_ = -1;
  }
  else {
    buf_00 = xmlBufFromBuffer(buffer);
    iVar1 = xmlBufGetNodeContent(buf_00,cur);
    pxVar2 = xmlBufBackToBuffer(buf_00);
    if ((iVar1 < 0) || (pxVar2 == (xmlBufferPtr)0x0)) {
      buffer_local._4_4_ = -1;
    }
    else {
      buffer_local._4_4_ = 0;
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int
xmlNodeBufGetContent(xmlBufferPtr buffer, const xmlNode *cur)
{
    xmlBufPtr buf;
    int ret;

    if ((cur == NULL) || (buffer == NULL)) return(-1);
    buf = xmlBufFromBuffer(buffer);
    ret = xmlBufGetNodeContent(buf, cur);
    buffer = xmlBufBackToBuffer(buf);
    if ((ret < 0) || (buffer == NULL))
        return(-1);
    return(0);
}